

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

Value<char> * __thiscall Qentem::Value<char>::operator[](Value<char> *this,SizeT index)

{
  SizeT SVar1;
  Value<char> *pVVar2;
  Value<char> local_40;
  undefined8 local_28;
  Value<char> *val;
  ValueType type;
  Value<char> *pVStack_18;
  SizeT index_local;
  Value<char> *this_local;
  
  val._4_4_ = index;
  pVStack_18 = this;
  val._3_1_ = Type(this);
  if (val._3_1_ == Array) {
    SVar1 = Array<Qentem::Value<char>_>::Size((Array<Qentem::Value<char>_> *)this);
    if (val._4_4_ < SVar1) {
      pVVar2 = Array<Qentem::Value<char>_>::Storage((Array<Qentem::Value<char>_> *)this);
      return pVVar2 + val._4_4_;
    }
  }
  else {
    if (val._3_1_ == Object) {
      pVVar2 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::GetValue
                         ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)this,val._4_4_);
      if (pVVar2 != (Value<char> *)0x0) {
        return pVVar2;
      }
      local_28 = 0;
    }
    reset(this);
    setTypeToArray(this);
  }
  SVar1 = Array<Qentem::Value<char>_>::Size((Array<Qentem::Value<char>_> *)this);
  if (SVar1 == val._4_4_) {
    Value(&local_40);
    Array<Qentem::Value<char>_>::operator+=((Array<Qentem::Value<char>_> *)this,&local_40);
    ~Value(&local_40);
  }
  else {
    Array<Qentem::Value<char>_>::ResizeAndInitialize
              ((Array<Qentem::Value<char>_> *)this,val._4_4_ + 1);
  }
  pVVar2 = Array<Qentem::Value<char>_>::Storage((Array<Qentem::Value<char>_> *)this);
  return pVVar2 + val._4_4_;
}

Assistant:

Value &operator[](SizeT index) {
        const ValueType type = Type();

        if (type == ValueType::Array) {
            if (array_.Size() > index) {
                return (array_.Storage()[index]);
            }
        } else {
            if (type == ValueType::Object) {
                Value *val = object_.GetValue(index);

                if (val != nullptr) {
                    return *val;
                }
            }

            reset();
            setTypeToArray();
        }

        if (array_.Size() == index) {
            array_ += Value{};
        } else {
            array_.ResizeAndInitialize(index + SizeT{1});
        }

        return (array_.Storage()[index]);
    }